

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_flags_for_ground_items.hpp
# Opt level: O0

void PatchFlagsForGroundItems::handle_set_flag_for_item_entity(ROM *rom)

{
  size_t *this;
  initializer_list<md::AddressRegister> __l;
  initializer_list<md::AddressRegister> __l_00;
  initializer_list<md::AddressRegister> __l_01;
  initializer_list<md::AddressRegister> __l_02;
  initializer_list<md::DataRegister> __l_03;
  initializer_list<md::DataRegister> __l_04;
  size_t sVar1;
  uint32_t uVar2;
  Code *pCVar3;
  Code local_748;
  allocator<char> local_6c9;
  string local_6c8;
  uint32_t local_6a8;
  allocator<md::AddressRegister> local_6a1;
  uint32_t shop_hook_func_addr;
  iterator local_690;
  size_type local_688;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_680;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_668;
  AddressRegister local_648;
  allocator<md::AddressRegister> local_631;
  AddressRegister local_630;
  iterator local_620;
  size_type local_618;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_610;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_5f8;
  allocator<char> local_5d9;
  string local_5d8;
  allocator<char> local_5b1;
  string local_5b0;
  DataRegister local_590;
  DataRegister local_580;
  DataRegister local_570;
  undefined1 local_560 [8];
  Code shop_hook_func;
  allocator<char> local_469;
  string local_468;
  uint32_t local_448;
  allocator<md::AddressRegister> local_441;
  uint32_t ground_hook_func_addr;
  iterator local_430;
  size_type local_428;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_420;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_408;
  AddressRegister local_3e8;
  allocator<md::AddressRegister> local_3d1;
  AddressRegister local_3d0;
  iterator local_3c0;
  size_type local_3b8;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_3b0;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_398;
  allocator<char> local_379;
  string local_378;
  allocator<char> local_351;
  string local_350;
  DataRegister local_330;
  DataRegister local_320;
  DataRegister local_310;
  undefined1 local_300 [8];
  Code ground_hook_func;
  string local_280;
  uint32_t local_25c;
  undefined1 auStack_258 [4];
  uint32_t func_set_flag_addr;
  pointer pAStack_250;
  pointer local_248;
  allocator<md::DataRegister> local_231;
  DataRegister local_230;
  DataRegister local_220;
  iterator local_210;
  size_type local_208;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_200;
  DataRegister local_1e8;
  AddressRegister local_1d8;
  AddressWithIndex local_1c8;
  DataRegister local_1a8;
  DataRegister local_198;
  DataRegister local_188;
  DataRegister local_178;
  DataRegister local_168;
  DataRegister local_158;
  DataRegister local_148;
  AddressRegister local_138;
  AddressInRegister local_128;
  DataRegister local_108;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_f8;
  allocator<md::DataRegister> local_dd [13];
  DataRegister local_d0;
  DataRegister local_c0;
  iterator local_b0;
  size_type local_a8;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_a0;
  undefined1 local_88 [8];
  Code func;
  ROM *rom_local;
  
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)rom;
  md::Code::Code((Code *)local_88);
  md::DataRegister::DataRegister(&local_d0,'\0');
  md::DataRegister::DataRegister(&local_c0,'\x01');
  local_b0 = &local_d0;
  local_a8 = 2;
  std::allocator<md::DataRegister>::allocator(local_dd);
  __l_04._M_len = local_a8;
  __l_04._M_array = local_b0;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_a0,__l_04,local_dd);
  local_f8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector(&local_f8);
  md::Code::movem_to_stack((Code *)local_88,&local_a0,&local_f8);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_f8);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_a0);
  std::allocator<md::DataRegister>::~allocator(local_dd);
  md::DataRegister::DataRegister(&local_108,'\0');
  md::Code::clrl((Code *)local_88,(Param *)&local_108);
  md::AddressRegister::AddressRegister(&local_138,'\x05');
  addr_<unsigned_char>(&local_128,&local_138,':');
  md::DataRegister::DataRegister(&local_148,'\0');
  md::Code::moveb((Code *)local_88,&local_128.super_Param,(Param *)&local_148);
  md::DataRegister::DataRegister(&local_158,'\0');
  md::Code::lsrb((Code *)local_88,'\x02',&local_158);
  md::DataRegister::DataRegister(&local_168,'\0');
  md::DataRegister::DataRegister(&local_178,'\x01');
  md::Code::movel((Code *)local_88,(Param *)&local_168,(Param *)&local_178);
  md::DataRegister::DataRegister(&local_188,'\x01');
  md::Code::andib((Code *)local_88,'\a',(Param *)&local_188);
  md::DataRegister::DataRegister(&local_198,'\0');
  md::Code::lsrb((Code *)local_88,'\x03',&local_198);
  md::DataRegister::DataRegister(&local_1a8,'\x01');
  md::AddressRegister::AddressRegister(&local_1d8,'\0');
  md::DataRegister::DataRegister(&local_1e8,'\0');
  addr_<void>(&local_1c8,&local_1d8,&local_1e8,'\0',LONG);
  md::Code::bset((Code *)local_88,&local_1a8,&local_1c8.super_Param);
  md::DataRegister::DataRegister(&local_230,'\0');
  md::DataRegister::DataRegister(&local_220,'\x01');
  local_210 = &local_230;
  local_208 = 2;
  std::allocator<md::DataRegister>::allocator(&local_231);
  __l_03._M_len = local_208;
  __l_03._M_array = local_210;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_200,__l_03,&local_231);
  _auStack_258 = (pointer)0x0;
  pAStack_250 = (pointer)0x0;
  local_248 = (pointer)0x0;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            ((vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)auStack_258);
  md::Code::movem_from_stack
            ((Code *)local_88,&local_200,
             (vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)auStack_258);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector
            ((vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)auStack_258);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_200);
  std::allocator<md::DataRegister>::~allocator(&local_231);
  md::Code::rts((Code *)local_88);
  sVar1 = func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"",
             (allocator<char> *)
             ((long)&ground_hook_func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count + 7))
  ;
  uVar2 = md::ROM::inject_code((ROM *)sVar1,(Code *)local_88,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&ground_hook_func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count + 7))
  ;
  local_25c = uVar2;
  md::Code::Code((Code *)local_300);
  md::DataRegister::DataRegister(&local_310,'\x02');
  md::DataRegister::DataRegister(&local_320,'\0');
  md::Code::movew((Code *)local_300,(Param *)&local_310,(Param *)&local_320);
  md::DataRegister::DataRegister(&local_330,'\0');
  md::Code::cmpib((Code *)local_300,'\x7f',(Param *)&local_330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"archipelago",&local_351);
  md::Code::beq((Code *)local_300,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator(&local_351);
  md::Code::jsr((Code *)local_300,0x291d6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"archipelago",&local_379);
  md::Code::label((Code *)local_300,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  local_398.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_398.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector(&local_398);
  md::AddressRegister::AddressRegister(&local_3d0,'\0');
  local_3c0 = &local_3d0;
  local_3b8 = 1;
  std::allocator<md::AddressRegister>::allocator(&local_3d1);
  __l_02._M_len = local_3b8;
  __l_02._M_array = local_3c0;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_3b0,__l_02,&local_3d1);
  md::Code::movem_to_stack((Code *)local_300,&local_398,&local_3b0);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_3b0);
  std::allocator<md::AddressRegister>::~allocator(&local_3d1);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_398);
  md::AddressRegister::AddressRegister(&local_3e8,'\0');
  md::Code::lea((Code *)local_300,0xff1060,&local_3e8);
  md::Code::jsr((Code *)local_300,local_25c);
  local_408.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_408.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector(&local_408);
  md::AddressRegister::AddressRegister((AddressRegister *)&ground_hook_func_addr,'\0');
  local_430 = (iterator)&ground_hook_func_addr;
  local_428 = 1;
  std::allocator<md::AddressRegister>::allocator(&local_441);
  __l_01._M_len = local_428;
  __l_01._M_array = local_430;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_420,__l_01,&local_441);
  md::Code::movem_from_stack((Code *)local_300,&local_408,&local_420);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_420);
  std::allocator<md::AddressRegister>::~allocator(&local_441);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_408);
  md::Code::rts((Code *)local_300);
  sVar1 = func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"",&local_469);
  uVar2 = md::ROM::inject_code((ROM *)sVar1,(Code *)local_300,&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator(&local_469);
  sVar1 = func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count;
  shop_hook_func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this = &shop_hook_func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_448 = uVar2;
  md::Code::Code((Code *)this);
  pCVar3 = md::Code::jsr((Code *)this,local_448);
  md::ROM::set_code((ROM *)sVar1,0x24b1a,pCVar3);
  md::Code::~Code((Code *)&shop_hook_func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count);
  md::Code::Code((Code *)local_560);
  md::DataRegister::DataRegister(&local_570,'\x02');
  md::DataRegister::DataRegister(&local_580,'\0');
  md::Code::movew((Code *)local_560,(Param *)&local_570,(Param *)&local_580);
  md::DataRegister::DataRegister(&local_590,'\0');
  md::Code::cmpib((Code *)local_560,'\x7f',(Param *)&local_590);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b0,"archipelago",&local_5b1);
  md::Code::beq((Code *)local_560,&local_5b0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::allocator<char>::~allocator(&local_5b1);
  md::Code::jsr((Code *)local_560,0x291d6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d8,"archipelago",&local_5d9);
  md::Code::label((Code *)local_560,&local_5d8);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::allocator<char>::~allocator(&local_5d9);
  local_5f8.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5f8.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5f8.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector(&local_5f8);
  md::AddressRegister::AddressRegister(&local_630,'\0');
  local_620 = &local_630;
  local_618 = 1;
  std::allocator<md::AddressRegister>::allocator(&local_631);
  __l_00._M_len = local_618;
  __l_00._M_array = local_620;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_610,__l_00,&local_631);
  md::Code::movem_to_stack((Code *)local_560,&local_5f8,&local_610);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_610);
  std::allocator<md::AddressRegister>::~allocator(&local_631);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_5f8);
  md::AddressRegister::AddressRegister(&local_648,'\0');
  md::Code::lea((Code *)local_560,0xff1064,&local_648);
  md::Code::jsr((Code *)local_560,local_25c);
  local_668.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_668.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_668.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector(&local_668);
  md::AddressRegister::AddressRegister((AddressRegister *)&shop_hook_func_addr,'\0');
  local_690 = (iterator)&shop_hook_func_addr;
  local_688 = 1;
  std::allocator<md::AddressRegister>::allocator(&local_6a1);
  __l._M_len = local_688;
  __l._M_array = local_690;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_680,__l,&local_6a1);
  md::Code::movem_from_stack((Code *)local_560,&local_668,&local_680);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_680);
  std::allocator<md::AddressRegister>::~allocator(&local_6a1);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_668);
  md::Code::rts((Code *)local_560);
  sVar1 = func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c8,"",&local_6c9);
  uVar2 = md::ROM::inject_code((ROM *)sVar1,(Code *)local_560,&local_6c8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::allocator<char>::~allocator(&local_6c9);
  sVar1 = func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_748._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_748._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_748._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_748._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_748._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_748._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_748._labels._M_t._M_impl._0_8_ = 0;
  local_748._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_748._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  local_748._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_748._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_748._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_748._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_748._pending_branches._M_t._M_impl._0_8_ = 0;
  local_748._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_748._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_748._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_6a8 = uVar2;
  md::Code::Code(&local_748);
  pCVar3 = md::Code::jsr(&local_748,local_6a8);
  md::ROM::set_code((ROM *)sVar1,0x24f3e,pCVar3);
  md::Code::~Code(&local_748);
  md::Code::~Code((Code *)local_560);
  md::Code::~Code((Code *)local_300);
  md::Code::~Code((Code *)local_88);
  return;
}

Assistant:

static void handle_set_flag_for_item_entity(md::ROM& rom)
    {
        md::Code func;
        func.movem_to_stack({ reg_D0, reg_D1 }, {});
        {
            func.clrl(reg_D0);
            func.moveb(addr_(reg_A5, OFFSET_ENTITY_GROUND_ITEM_ID), reg_D0);
            func.lsrb(2, reg_D0);                                               // D0 contains flag ID
            func.movel(reg_D0, reg_D1);
            func.andib(0x07, reg_D1);                                           // D1 contains flag bit
            func.lsrb(3, reg_D0);                                               // D0 contains flag byte
            func.bset(reg_D1, addr_(reg_A0, reg_D0));
        }
        func.movem_from_stack({ reg_D0, reg_D1 }, {});
        func.rts();
        uint32_t func_set_flag_addr = rom.inject_code(func);

        // Add a procedure extension to call the new set_flag function when grabbing a ground item
        md::Code ground_hook_func;
        {
            ground_hook_func.movew(reg_D2, reg_D0);
            ground_hook_func.cmpib(ITEM_ARCHIPELAGO, reg_D0);
            ground_hook_func.beq("archipelago");
            {
                // If item is an Archipelago item, don't call the GetItem function
                ground_hook_func.jsr(0x291D6);  // GetItem
            }
            ground_hook_func.label("archipelago");

            ground_hook_func.movem_to_stack({}, { reg_A0 });
            ground_hook_func.lea(GROUND_ITEM_FLAGS_START_ADDR, reg_A0);
            ground_hook_func.jsr(func_set_flag_addr);
            ground_hook_func.movem_from_stack({}, { reg_A0 });
        }
        ground_hook_func.rts();
        uint32_t ground_hook_func_addr = rom.inject_code(ground_hook_func);
        rom.set_code(0x24B1A, md::Code().jsr(ground_hook_func_addr));  // Ground items

        // Add a procedure extension to call the new set_flag function when buying a shop item
        md::Code shop_hook_func;
        {
            shop_hook_func.movew(reg_D2, reg_D0);
            shop_hook_func.cmpib(ITEM_ARCHIPELAGO, reg_D0);
            shop_hook_func.beq("archipelago");
            {
                // If item is an Archipelago item, don't call the GetItem function
                shop_hook_func.jsr(0x291D6);  // GetItem
            }
            shop_hook_func.label("archipelago");

            shop_hook_func.movem_to_stack({}, { reg_A0 });
            shop_hook_func.lea(SHOP_ITEM_FLAGS_START_ADDR, reg_A0);
            shop_hook_func.jsr(func_set_flag_addr);
            shop_hook_func.movem_from_stack({}, { reg_A0 });
        }
        shop_hook_func.rts();
        uint32_t shop_hook_func_addr = rom.inject_code(shop_hook_func);
        rom.set_code(0x24F3E, md::Code().jsr(shop_hook_func_addr));  // Shop items
    }